

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Battle.cpp
# Opt level: O3

void __thiscall Battle::showStats(Battle *this,Player *player)

{
  ostream *poVar1;
  string local_30;
  
  UI::clearScreen();
  Player::getName_abi_cxx11_(&local_30,player);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," won this battle! Congratulations!",0x22);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  Keyboard::getch();
  return;
}

Assistant:

void Battle::showStats(Player & player) {
    UI::clearScreen();
    std::cout << player.getName() << " won this battle! Congratulations!" << std::endl;
    Keyboard::getch();
}